

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MAW.cpp
# Opt level: O0

void __thiscall OpenMD::MAW::initialize(MAW *this)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  reference pvVar6;
  size_type sVar7;
  long in_RDI;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar8;
  RealType cb1;
  RealType ca1;
  RealType Re;
  RealType beta;
  RealType De;
  MAWInteractionType *mit;
  int atid2;
  int atid1;
  AtomType *at2;
  AtomType *at1;
  int mtid2;
  int mtid1;
  NonBondedInteractionType *nbt;
  KeyType keys;
  MapTypeIterator j;
  NonBondedInteractionTypeContainer *nbiTypes;
  AtomType *in_stack_fffffffffffffd88;
  MapTypeIterator *in_stack_fffffffffffffd90;
  TypeContainer<OpenMD::NonBondedInteractionType,_2> *in_stack_fffffffffffffd98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffda0;
  MapTypeIterator *in_stack_fffffffffffffda8;
  TypeContainer<OpenMD::NonBondedInteractionType,_2> *in_stack_fffffffffffffdb0;
  size_type in_stack_fffffffffffffdb8;
  string *this_00;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffdc0;
  errorStruct *peVar9;
  string *in_stack_fffffffffffffdc8;
  ForceField *in_stack_fffffffffffffdd0;
  AtomType *pAVar10;
  undefined4 in_stack_fffffffffffffde0;
  value_type in_stack_fffffffffffffde4;
  RealType in_stack_fffffffffffffde8;
  undefined7 in_stack_fffffffffffffdf0;
  undefined1 in_stack_fffffffffffffdf7;
  _Rb_tree_const_iterator<int> in_stack_fffffffffffffdf8;
  value_type in_stack_fffffffffffffe04;
  AtomType *in_stack_fffffffffffffe08;
  undefined7 in_stack_fffffffffffffe10;
  undefined1 in_stack_fffffffffffffe17;
  string local_f8 [32];
  string local_d8 [32];
  ForceField *local_b8;
  _Base_ptr local_b0;
  undefined1 local_a8;
  int local_9c;
  _Base_ptr local_98;
  undefined1 local_90;
  int local_84;
  AtomType *local_80;
  AtomType *local_78;
  value_type local_48;
  value_type local_44;
  AtomType *local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  _Rb_tree_iterator<std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<int,_OpenMD::NonBondedInteractionType_*>_>_>
  local_20;
  NonBondedInteractionTypeContainer *local_18;
  undefined4 local_c;
  
  std::set<int,_std::less<int>,_std::allocator<int>_>::clear
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x3a64f8);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x3a6511);
  std::
  vector<std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>,_std::allocator<std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>_>_>
  ::clear((vector<std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>,_std::allocator<std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>_>_>
           *)0x3a6522);
  ForceField::getNAtomType((ForceField *)0x3a6533);
  local_c = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::resize
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,&in_stack_fffffffffffffdb0->index_)
  ;
  local_18 = ForceField::getNonBondedInteractionTypes(*(ForceField **)(in_RDI + 0x70));
  std::
  _Rb_tree_iterator<std::pair<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::pair<int,_OpenMD::NonBondedInteractionType_*>_>_>
  ::_Rb_tree_iterator(&local_20);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x3a6591);
  local_40 = (AtomType *)
             TypeContainer<OpenMD::NonBondedInteractionType,_2>::beginType
                       (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  while (local_40 != (AtomType *)0x0) {
    bVar1 = NonBondedInteractionType::isMAW((NonBondedInteractionType *)local_40);
    if (bVar1) {
      TypeContainer<OpenMD::NonBondedInteractionType,_2>::getKeys
                (in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(in_stack_fffffffffffffda0,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffd98);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(in_stack_fffffffffffffda0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_38,0);
      local_78 = ForceField::getAtomType(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
      if (local_78 == (AtomType *)0x0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_38,0);
        uVar3 = std::__cxx11::string::c_str();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_38,0);
        uVar4 = std::__cxx11::string::c_str();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_38,1);
        uVar5 = std::__cxx11::string::c_str();
        snprintf(painCave.errMsg,2000,
                 "MAW::initialize could not find AtomType %s\n\tto for for %s - %s interaction.\n",
                 uVar3,uVar4,uVar5);
        painCave.severity = 1;
        painCave.isFatal = 1;
        simError();
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_38,1);
      local_80 = ForceField::getAtomType(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
      if (local_80 == (AtomType *)0x0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_38,1);
        uVar3 = std::__cxx11::string::c_str();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_38,0);
        uVar4 = std::__cxx11::string::c_str();
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_38,1);
        uVar5 = std::__cxx11::string::c_str();
        snprintf(painCave.errMsg,2000,
                 "MAW::initialize could not find AtomType %s\n\tfor %s - %s nonbonded interaction.\n"
                 ,uVar3,uVar4,uVar5);
        painCave.severity = 1;
        painCave.isFatal = 1;
        simError();
      }
      local_84 = AtomType::getIdent(local_78);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)local_84);
      if (*pvVar6 == -1) {
        in_stack_fffffffffffffe08 = (AtomType *)(in_RDI + 0x10);
        sVar7 = std::set<int,_std::less<int>,_std::allocator<int>_>::size
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)0x3a6927);
        local_44 = (value_type)sVar7;
        pVar8 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)
                           in_stack_fffffffffffffdb0,
                           (value_type_conflict2 *)in_stack_fffffffffffffda8);
        local_98 = (_Base_ptr)pVar8.first._M_node;
        in_stack_fffffffffffffe17 = pVar8.second;
        in_stack_fffffffffffffe04 = local_44;
        local_90 = in_stack_fffffffffffffe17;
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)local_84);
        *pvVar6 = in_stack_fffffffffffffe04;
      }
      iVar2 = AtomType::getIdent(local_80);
      local_9c = iVar2;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)iVar2);
      if (*pvVar6 == -1) {
        in_stack_fffffffffffffde8 = (RealType)(in_RDI + 0x10);
        sVar7 = std::set<int,_std::less<int>,_std::allocator<int>_>::size
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)0x3a69ee);
        local_48 = (value_type)sVar7;
        pVar8 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)
                           in_stack_fffffffffffffdb0,
                           (value_type_conflict2 *)in_stack_fffffffffffffda8);
        in_stack_fffffffffffffdf8 = pVar8.first._M_node;
        in_stack_fffffffffffffdf7 = pVar8.second;
        in_stack_fffffffffffffde4 = local_48;
        local_b0 = in_stack_fffffffffffffdf8._M_node;
        local_a8 = in_stack_fffffffffffffdf7;
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)local_9c);
        *pvVar6 = in_stack_fffffffffffffde4;
      }
      pAVar10 = local_40;
      if (local_40 == (AtomType *)0x0) {
        in_stack_fffffffffffffdd0 = (ForceField *)0x0;
      }
      else {
        in_stack_fffffffffffffdd0 =
             (ForceField *)
             __dynamic_cast(local_40,&NonBondedInteractionType::typeinfo,
                            &MAWInteractionType::typeinfo,0);
      }
      local_b8 = in_stack_fffffffffffffdd0;
      if (in_stack_fffffffffffffdd0 == (ForceField *)0x0) {
        AtomType::getName_abi_cxx11_(in_stack_fffffffffffffd88);
        in_stack_fffffffffffffdc8 = (string *)std::__cxx11::string::c_str();
        AtomType::getName_abi_cxx11_(in_stack_fffffffffffffd88);
        this_00 = local_f8;
        uVar3 = std::__cxx11::string::c_str();
        peVar9 = &painCave;
        snprintf(painCave.errMsg,2000,
                 "MAW::initialize could not convert NonBondedInteractionType\n\tto MAWInteractionType for %s - %s interaction.\n"
                 ,in_stack_fffffffffffffdc8,uVar3);
        std::__cxx11::string::~string(this_00);
        std::__cxx11::string::~string(local_d8);
        peVar9->severity = 1;
        peVar9->isFatal = 1;
        simError();
      }
      in_stack_fffffffffffffdb0 =
           (TypeContainer<OpenMD::NonBondedInteractionType,_2> *)
           MAWInteractionType::getD((MAWInteractionType *)local_b8);
      in_stack_fffffffffffffda8 =
           (MapTypeIterator *)MAWInteractionType::getBeta((MAWInteractionType *)local_b8);
      in_stack_fffffffffffffda0 =
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)MAWInteractionType::getR((MAWInteractionType *)local_b8);
      in_stack_fffffffffffffd98 =
           (TypeContainer<OpenMD::NonBondedInteractionType,_2> *)
           MAWInteractionType::getCA1((MAWInteractionType *)local_b8);
      in_stack_fffffffffffffd90 =
           (MapTypeIterator *)MAWInteractionType::getCB1((MAWInteractionType *)local_b8);
      addExplicitInteraction
                ((MAW *)CONCAT17(in_stack_fffffffffffffe17,in_stack_fffffffffffffe10),
                 in_stack_fffffffffffffe08,(AtomType *)CONCAT44(in_stack_fffffffffffffe04,iVar2),
                 (RealType)in_stack_fffffffffffffdf8._M_node,
                 (RealType)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
                 in_stack_fffffffffffffde8,
                 (RealType)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0),
                 (RealType)pAVar10);
    }
    in_stack_fffffffffffffd88 =
         (AtomType *)
         TypeContainer<OpenMD::NonBondedInteractionType,_2>::nextType
                   (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    local_40 = in_stack_fffffffffffffd88;
  }
  *(undefined1 *)(in_RDI + 8) = 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_fffffffffffffda0);
  return;
}

Assistant:

void MAW::initialize() {
    MAWtypes.clear();
    MAWtids.clear();
    MixingMap.clear();
    MAWtids.resize(forceField_->getNAtomType(), -1);

    ForceField::NonBondedInteractionTypeContainer* nbiTypes =
        forceField_->getNonBondedInteractionTypes();
    ForceField::NonBondedInteractionTypeContainer::MapTypeIterator j;
    ForceField::NonBondedInteractionTypeContainer::KeyType keys;
    NonBondedInteractionType* nbt;
    int mtid1, mtid2;

    for (nbt = nbiTypes->beginType(j); nbt != NULL;
         nbt = nbiTypes->nextType(j)) {
      if (nbt->isMAW()) {
        keys          = nbiTypes->getKeys(j);
        AtomType* at1 = forceField_->getAtomType(keys[0]);
        if (at1 == NULL) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "MAW::initialize could not find AtomType %s\n"
                   "\tto for for %s - %s interaction.\n",
                   keys[0].c_str(), keys[0].c_str(), keys[1].c_str());
          painCave.severity = OPENMD_ERROR;
          painCave.isFatal  = 1;
          simError();
        }

        AtomType* at2 = forceField_->getAtomType(keys[1]);
        if (at2 == NULL) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "MAW::initialize could not find AtomType %s\n"
                   "\tfor %s - %s nonbonded interaction.\n",
                   keys[1].c_str(), keys[0].c_str(), keys[1].c_str());
          painCave.severity = OPENMD_ERROR;
          painCave.isFatal  = 1;
          simError();
        }

        int atid1 = at1->getIdent();
        if (MAWtids[atid1] == -1) {
          mtid1 = MAWtypes.size();
          MAWtypes.insert(atid1);
          MAWtids[atid1] = mtid1;
        }
        int atid2 = at2->getIdent();
        if (MAWtids[atid2] == -1) {
          mtid2 = MAWtypes.size();
          MAWtypes.insert(atid2);
          MAWtids[atid2] = mtid2;
        }

        MAWInteractionType* mit = dynamic_cast<MAWInteractionType*>(nbt);

        if (mit == NULL) {
          snprintf(
              painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
              "MAW::initialize could not convert NonBondedInteractionType\n"
              "\tto MAWInteractionType for %s - %s interaction.\n",
              at1->getName().c_str(), at2->getName().c_str());
          painCave.severity = OPENMD_ERROR;
          painCave.isFatal  = 1;
          simError();
        }

        RealType De   = mit->getD();
        RealType beta = mit->getBeta();
        RealType Re   = mit->getR();
        RealType ca1  = mit->getCA1();
        RealType cb1  = mit->getCB1();

        addExplicitInteraction(at1, at2, De, beta, Re, ca1, cb1);
      }
    }
    initialized_ = true;
  }